

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

int getCursorPosition(int ifd,int ofd)

{
  int iVar1;
  ssize_t sVar2;
  int in_ESI;
  int in_EDI;
  uint i;
  int rows;
  int cols;
  char buf [32];
  uint local_44;
  undefined1 local_40 [4];
  int local_3c;
  char local_38 [48];
  int local_8;
  int local_4;
  
  local_44 = 0;
  local_8 = in_EDI;
  sVar2 = write(in_ESI,"\x1b[6n",4);
  if (sVar2 == 4) {
    for (; ((local_44 < 0x1f && (sVar2 = read(local_8,local_38 + local_44,1), sVar2 == 1)) &&
           (local_38[local_44] != 'R')); local_44 = local_44 + 1) {
    }
    local_38[local_44] = '\0';
    if ((local_38[0] == '\x1b') && (local_38[1] == '[')) {
      iVar1 = __isoc99_sscanf(local_38 + 2,"%d;%d",local_40,&local_3c);
      if (iVar1 == 2) {
        local_4 = local_3c;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int getCursorPosition(int ifd, int ofd) {
    char buf[32];
    int cols, rows;
    unsigned int i = 0;

    /* Report cursor location */
    if (write(ofd, "\x1b[6n", 4) != 4) return -1;

    /* Read the response: ESC [ rows ; cols R */
    while (i < sizeof(buf)-1) {
        if (read(ifd,buf+i,1) != 1) break;
        if (buf[i] == 'R') break;
        i++;
    }
    buf[i] = '\0';

    /* Parse it. */
    if (buf[0] != ESC || buf[1] != '[') return -1;
    if (sscanf(buf+2,"%d;%d",&rows,&cols) != 2) return -1;
    return cols;
}